

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O0

void __thiscall
branch_and_reduce_algorithm::addStartingSolution
          (branch_and_reduce_algorithm *this,vector<int,_std::allocator<int>_> *solution,
          int solutionSize)

{
  value_type vVar1;
  size_type sVar2;
  size_type sVar3;
  ostream *this_00;
  void *this_01;
  reference pvVar4;
  int local_20;
  int i;
  int solutionSize_local;
  vector<int,_std::allocator<int>_> *solution_local;
  branch_and_reduce_algorithm *this_local;
  
  sVar2 = std::vector<int,_std::allocator<int>_>::size(solution);
  sVar3 = std::vector<int,_std::allocator<int>_>::size(&this->y);
  if (sVar2 != sVar3) {
    this_00 = std::operator<<((ostream *)&std::cout,"ERROR: invalid solution std::vector!");
    this_01 = (void *)std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(this_01,std::flush<char,std::char_traits<char>>);
  }
  local_20 = 0;
  while( true ) {
    sVar2 = std::vector<int,_std::allocator<int>_>::size(solution);
    if (sVar2 <= (ulong)(long)local_20) break;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](solution,(long)local_20);
    vVar1 = *pvVar4;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->y,(long)local_20);
    *pvVar4 = vVar1;
    local_20 = local_20 + 1;
  }
  this->opt = solutionSize;
  this->startingSolutionIsBest = true;
  this->numBranchesPrunedByStartingSolution = 0;
  return;
}

Assistant:

void branch_and_reduce_algorithm::addStartingSolution(std::vector<int> solution, int solutionSize)
{
    if (solution.size() != y.size())
    {
        cout << "ERROR: invalid solution std::vector!" << endl
             << flush;
    }
    for (int i = 0; i < solution.size(); ++i)
    {
        y[i] = solution[i];
    }
    opt = solutionSize;

    startingSolutionIsBest = true;
    numBranchesPrunedByStartingSolution = 0;
}